

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

int __thiscall
Fl_PostScript_File_Device::start_job
          (Fl_PostScript_File_Device *this,int pagecount,Page_Format format,Page_Layout layout)

{
  int iVar1;
  Fl_PostScript_Graphics_Driver *this_00;
  char *pcVar2;
  FILE *pFVar3;
  Fl_PostScript_Graphics_Driver *ps;
  undefined1 local_78 [8];
  Fl_Native_File_Chooser fnfc;
  Page_Layout layout_local;
  Page_Format format_local;
  int pagecount_local;
  Fl_PostScript_File_Device *this_local;
  
  fnfc.field_10._4_4_ = layout;
  Fl_Native_File_Chooser::Fl_Native_File_Chooser((Fl_Native_File_Chooser *)local_78,0);
  Fl_Native_File_Chooser::title((Fl_Native_File_Chooser *)local_78,file_chooser_title);
  Fl_Native_File_Chooser::type((Fl_Native_File_Chooser *)local_78,4);
  Fl_Native_File_Chooser::options((Fl_Native_File_Chooser *)local_78,1);
  Fl_Native_File_Chooser::filter((Fl_Native_File_Chooser *)local_78,"PostScript\t*.ps\n");
  iVar1 = Fl_Native_File_Chooser::show((Fl_Native_File_Chooser *)local_78);
  if (iVar1 == 0) {
    this_00 = driver(this);
    pcVar2 = Fl_Native_File_Chooser::filename((Fl_Native_File_Chooser *)local_78);
    pFVar3 = fl_fopen(pcVar2,"w");
    this_00->output = pFVar3;
    if (this_00->output == (FILE *)0x0) {
      this_local._4_4_ = 2;
    }
    else {
      pcVar2 = Fl_Native_File_Chooser::filename((Fl_Native_File_Chooser *)local_78);
      pcVar2 = strdup(pcVar2);
      this_00->ps_filename_ = pcVar2;
      Fl_PostScript_Graphics_Driver::start_postscript(this_00,pagecount,format,fnfc.field_10._4_4_);
      (*(this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device[3])();
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  Fl_Native_File_Chooser::~Fl_Native_File_Chooser((Fl_Native_File_Chooser *)local_78);
  return this_local._4_4_;
}

Assistant:

int Fl_PostScript_File_Device::start_job (int pagecount, enum Fl_Paged_Device::Page_Format format, 
					  enum Fl_Paged_Device::Page_Layout layout)
{
  Fl_Native_File_Chooser fnfc;
  fnfc.title(Fl_PostScript_File_Device::file_chooser_title);
  fnfc.type(Fl_Native_File_Chooser::BROWSE_SAVE_FILE);
  fnfc.options(Fl_Native_File_Chooser::SAVEAS_CONFIRM);
  fnfc.filter("PostScript\t*.ps\n");
  // Show native chooser
  if ( fnfc.show() ) return 1;
  Fl_PostScript_Graphics_Driver *ps = driver();
  ps->output = fl_fopen(fnfc.filename(), "w");
  if(ps->output == NULL) return 2;
  ps->ps_filename_ = strdup(fnfc.filename());
  ps->start_postscript(pagecount, format, layout);
  this->set_current();
  return 0;
}